

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.cpp
# Opt level: O2

int __thiscall duckdb::Linenoise::CompleteLine(Linenoise *this,EscapeSequence *current_sequence)

{
  char *__s;
  size_t __maxlen;
  uint uVar1;
  char cVar2;
  ulong __n;
  EscapeSequence EVar3;
  int iVar4;
  reference pvVar5;
  ssize_t sVar6;
  pointer in_RCX;
  undefined7 uVar7;
  uint uVar8;
  int iVar9;
  char c;
  ulong local_118;
  uint local_10c;
  uint local_108;
  allocator local_101;
  ulong local_100;
  TabCompletion completion_list;
  Linenoise saved;
  
  c = '\0';
  TabComplete(&completion_list,this);
  if (completion_list.completions.
      super_vector<duckdb::Completion,_std::allocator<duckdb::Completion>_>.
      super__Vector_base<duckdb::Completion,_std::allocator<duckdb::Completion>_>._M_impl.
      super__Vector_impl_data._M_start ==
      completion_list.completions.
      super_vector<duckdb::Completion,_std::allocator<duckdb::Completion>_>.
      super__Vector_base<duckdb::Completion,_std::allocator<duckdb::Completion>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    iVar9 = 0;
    Terminal::Beep();
  }
  else {
    local_100 = 0;
    iVar9 = -1;
    local_10c = 0;
    local_118 = 0;
    uVar8 = 0;
    while ((local_100 & 1) == 0) {
      if (local_118 <
          (ulong)(((long)completion_list.completions.
                         super_vector<duckdb::Completion,_std::allocator<duckdb::Completion>_>.
                         super__Vector_base<duckdb::Completion,_std::allocator<duckdb::Completion>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)completion_list.completions.
                        super_vector<duckdb::Completion,_std::allocator<duckdb::Completion>_>.
                        super__Vector_base<duckdb::Completion,_std::allocator<duckdb::Completion>_>.
                        _M_impl.super__Vector_impl_data._M_start) / 0x28)) {
        Linenoise(&saved,this);
        pvVar5 = vector<duckdb::Completion,_true>::get<true>(&completion_list.completions,local_118)
        ;
        this->len = (pvVar5->completion)._M_string_length;
        pvVar5 = vector<duckdb::Completion,_true>::get<true>(&completion_list.completions,local_118)
        ;
        this->pos = pvVar5->cursor_pos;
        pvVar5 = vector<duckdb::Completion,_true>::get<true>(&completion_list.completions,local_118)
        ;
        this->buf = (pvVar5->completion)._M_dataplus._M_p;
        RefreshLine(this);
        this->len = saved.len;
        this->pos = saved.pos;
        this->buf = saved.buf;
        ~Linenoise(&saved);
      }
      else {
        RefreshLine(this);
      }
      sVar6 = ::read(this->ifd,&c,1);
      if ((int)sVar6 < 1) goto LAB_001ee4aa;
      ::std::__cxx11::string::string((string *)&saved,"\nComplete Character %d\n",&local_101);
      cVar2 = c;
      uVar8 = (uint)(byte)c;
      ::std::__cxx11::string::~string((string *)&saved);
      if (cVar2 == '\t') {
        in_RCX = (pointer)(((long)completion_list.completions.
                                  super_vector<duckdb::Completion,_std::allocator<duckdb::Completion>_>
                                  .
                                  super__Vector_base<duckdb::Completion,_std::allocator<duckdb::Completion>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)completion_list.completions.
                                 super_vector<duckdb::Completion,_std::allocator<duckdb::Completion>_>
                                 .
                                 super__Vector_base<duckdb::Completion,_std::allocator<duckdb::Completion>_>
                                 ._M_impl.super__Vector_impl_data._M_start) / 0x28);
        local_118 = (local_118 + 1) % (ulong)in_RCX;
      }
      else {
        local_108 = uVar8;
        if (uVar8 == 0x1b) {
          EVar3 = Terminal::ReadEscapeSequence(this->ifd);
          if (EVar3 != SHIFT_TAB) {
            if (EVar3 == ESCAPE) goto LAB_001ee3b8;
            *current_sequence = EVar3;
            goto LAB_001ee408;
          }
          if (local_118 == 0) {
LAB_001ee3b8:
            RefreshLine(this);
            *current_sequence = EVar3;
            local_100 = CONCAT71((int7)((ulong)current_sequence >> 8),1);
            uVar1 = local_10c & 1;
            local_10c = 0;
            uVar8 = local_108;
            if (uVar1 != 0) goto LAB_001ee408;
          }
          else {
            local_118 = local_118 - 1;
            uVar8 = local_108;
          }
        }
        else {
LAB_001ee408:
          __n = local_118;
          uVar7 = (undefined7)((ulong)in_RCX >> 8);
          local_100 = CONCAT71(uVar7,1);
          in_RCX = (pointer)CONCAT71(uVar7,1);
          local_10c = (uint)in_RCX;
          uVar8 = local_108;
          if (local_118 <
              (ulong)(((long)completion_list.completions.
                             super_vector<duckdb::Completion,_std::allocator<duckdb::Completion>_>.
                             super__Vector_base<duckdb::Completion,_std::allocator<duckdb::Completion>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)completion_list.completions.
                            super_vector<duckdb::Completion,_std::allocator<duckdb::Completion>_>.
                            super__Vector_base<duckdb::Completion,_std::allocator<duckdb::Completion>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x28)) {
            __s = this->buf;
            __maxlen = this->buflen;
            pvVar5 = vector<duckdb::Completion,_true>::get<true>
                               (&completion_list.completions,local_118);
            in_RCX = (pvVar5->completion)._M_dataplus._M_p;
            iVar4 = snprintf(__s,__maxlen,"%s",in_RCX);
            pvVar5 = vector<duckdb::Completion,_true>::get<true>(&completion_list.completions,__n);
            this->pos = pvVar5->cursor_pos;
            this->len = (long)iVar4;
            local_10c = (uint)CONCAT71((int7)(int3)((uint)iVar4 >> 8),1);
            uVar8 = local_108;
          }
        }
      }
    }
    iVar9 = (int)(char)uVar8;
  }
LAB_001ee4aa:
  ::std::vector<duckdb::Completion,_std::allocator<duckdb::Completion>_>::~vector
            ((vector<duckdb::Completion,_std::allocator<duckdb::Completion>_> *)&completion_list);
  return iVar9;
}

Assistant:

int Linenoise::CompleteLine(EscapeSequence &current_sequence) {
	int nread, nwritten;
	char c = 0;

	auto completion_list = TabComplete();
	auto &completions = completion_list.completions;
	if (completions.empty()) {
		Terminal::Beep();
	} else {
		bool stop = false;
		bool accept_completion = false;
		idx_t i = 0;

		while (!stop) {
			/* Show completion or original buffer */
			if (i < completions.size()) {
				Linenoise saved = *this;

				len = completions[i].completion.size();
				pos = completions[i].cursor_pos;
				buf = (char *)completions[i].completion.c_str();
				RefreshLine();
				len = saved.len;
				pos = saved.pos;
				buf = saved.buf;
			} else {
				RefreshLine();
			}

			nread = read(ifd, &c, 1);
			if (nread <= 0) {
				return -1;
			}

			Linenoise::Log("\nComplete Character %d\n", (int)c);
			switch (c) {
			case TAB: /* tab */
				i = (i + 1) % completions.size();
				break;
			case ESC: { /* escape */
				auto escape = Terminal::ReadEscapeSequence(ifd);
				switch (escape) {
				case EscapeSequence::SHIFT_TAB:
					// shift-tab: move backwards
					if (i == 0) {
						// pressing shift-tab at the first completion cancels completion
						RefreshLine();
						current_sequence = escape;
						stop = true;
					} else {
						i--;
					}
					break;
				case EscapeSequence::ESCAPE:
					/* Re-show original buffer */
					RefreshLine();
					current_sequence = escape;
					stop = true;
					break;
				default:
					current_sequence = escape;
					accept_completion = true;
					stop = true;
					break;
				}
				break;
			}
			default:
				accept_completion = true;
				stop = true;
				break;
			}
			if (stop && accept_completion && i < completions.size()) {
				/* Update buffer and return */
				if (i < completions.size()) {
					nwritten = snprintf(buf, buflen, "%s", completions[i].completion.c_str());
					pos = completions[i].cursor_pos;
					len = nwritten;
				}
			}
		}
	}
	return c; /* Return last read character */
}